

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void get_2d_footprint_cells
               (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *polygon,
               set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *cells,
               sbpl_xy_theta_pt_t pose,double res)

{
  pointer psVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int **grid;
  int *piVar6;
  int j;
  uint sy;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int i;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  int j_1;
  int iVar27;
  long lVar28;
  bool bVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int **local_128;
  sbpl_bfs_2d bfs;
  sbpl_2Dcell_t local_90;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> disc_polygon;
  
  if ((ulong)((long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
                   super__Vector_impl_data._M_start) < 0x11) {
    auVar33._8_8_ = res;
    auVar33._0_8_ = res;
    auVar34 = divpd(pose._0_16_,auVar33);
    bfs.dist_ = (int **)CONCAT44((int)auVar34._8_8_ - (uint)(pose.y < 0.0),
                                 (int)auVar34._0_8_ - (uint)(pose.x < 0.0));
    std::
    _Rb_tree<sbpl_2Dcell_t,sbpl_2Dcell_t,std::_Identity<sbpl_2Dcell_t>,std::less<sbpl_2Dcell_t>,std::allocator<sbpl_2Dcell_t>>
    ::_M_insert_unique<sbpl_2Dcell_t_const&>
              ((_Rb_tree<sbpl_2Dcell_t,sbpl_2Dcell_t,std::_Identity<sbpl_2Dcell_t>,std::less<sbpl_2Dcell_t>,std::allocator<sbpl_2Dcell_t>>
                *)cells,(sbpl_2Dcell_t *)&bfs);
  }
  else {
    dVar30 = cos(pose.theta);
    dVar31 = sin(pose.theta);
    disc_polygon.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    disc_polygon.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    disc_polygon.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
              (&disc_polygon,
               ((long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 4) + 1);
    auVar34._8_8_ = res;
    auVar34._0_8_ = res;
    iVar25 = 1000000000;
    iVar14 = -1000000000;
    uVar10 = 0;
    iVar27 = -1000000000;
    local_128 = (int **)0x3b9aca00;
    while( true ) {
      uVar13 = (ulong)uVar10;
      psVar1 = (polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar23 = (int)local_128;
      if ((ulong)((long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar13)
      break;
      auVar32._0_8_ = psVar1[uVar13].x * dVar30 + psVar1[uVar13].y * -dVar31 + pose.x;
      auVar32._8_8_ = psVar1[uVar13].x * dVar31 + psVar1[uVar13].y * dVar30 + pose.y;
      auVar33 = divpd(auVar32,auVar34);
      bfs.dist_ = (int **)CONCAT44((int)((double)(-(ulong)(0.0 < auVar32._8_8_) & 0x3fe0000000000000
                                                 | ~-(ulong)(0.0 < auVar32._8_8_) &
                                                   0xbfe0000000000000) + auVar33._8_8_),
                                   (int)((double)(-(ulong)(0.0 < auVar32._0_8_) & 0x3fe0000000000000
                                                 | ~-(ulong)(0.0 < auVar32._0_8_) &
                                                   0xbfe0000000000000) + auVar33._0_8_));
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (&disc_polygon,(value_type *)&bfs);
      if ((int)bfs.dist_ < iVar23) {
        local_128 = bfs.dist_;
      }
      local_128 = (int **)((ulong)local_128 & 0xffffffff);
      if (iVar27 < (int)bfs.dist_) {
        iVar27 = (int)bfs.dist_;
      }
      if (bfs.dist_._4_4_ < iVar25) {
        iVar25 = bfs.dist_._4_4_;
      }
      if (iVar14 < bfs.dist_._4_4_) {
        iVar14 = bfs.dist_._4_4_;
      }
      uVar10 = uVar10 + 1;
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              (&disc_polygon,
               disc_polygon.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar27 = iVar27 - iVar23;
    uVar10 = iVar27 + 3;
    uVar13 = (long)(int)uVar10 << 3;
    if (iVar27 < -3) {
      uVar13 = 0xffffffffffffffff;
    }
    grid = (int **)operator_new__(uVar13);
    iVar14 = iVar14 - iVar25;
    sy = iVar14 + 3;
    uVar13 = (long)(int)sy * 4;
    if (iVar14 < -3) {
      uVar13 = 0xffffffffffffffff;
    }
    uVar12 = 0;
    uVar26 = 0;
    if (0 < (int)sy) {
      uVar26 = (ulong)sy;
    }
    uVar24 = 0;
    if (0 < (int)uVar10) {
      uVar24 = (ulong)uVar10;
    }
    for (; uVar12 != uVar24; uVar12 = uVar12 + 1) {
      piVar6 = (int *)operator_new__(uVar13);
      grid[uVar12] = piVar6;
      for (uVar8 = 0; uVar26 != uVar8; uVar8 = uVar8 + 1) {
        piVar6[uVar8] = 0;
      }
    }
    iVar3 = iVar23 + -1;
    iVar4 = iVar25 + -1;
    for (uVar13 = 1;
        uVar13 < (ulong)((long)disc_polygon.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)disc_polygon.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar13 = (ulong)((int)uVar13 + 1)) {
      uVar5 = (int)uVar13 - 1;
      iVar16 = disc_polygon.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar5].first - iVar23;
      iVar9 = iVar16 + 1;
      iVar7 = disc_polygon.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[uVar5].second - iVar25;
      iVar17 = disc_polygon.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar13].first - iVar23;
      iVar19 = iVar17 + 1;
      iVar21 = disc_polygon.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar13].second - iVar25;
      iVar20 = iVar21 + 1;
      uVar22 = iVar21 - iVar7;
      iVar7 = iVar7 + 1;
      uVar5 = -uVar22;
      if (0 < (int)uVar22) {
        uVar5 = uVar22;
      }
      uVar18 = iVar17 - iVar16;
      uVar22 = -uVar18;
      if (0 < (int)uVar18) {
        uVar22 = uVar18;
      }
      iVar16 = iVar9;
      iVar17 = iVar19;
      if (uVar22 < uVar5) {
        iVar16 = iVar7;
        iVar17 = iVar20;
        iVar7 = iVar9;
        iVar20 = iVar19;
      }
      iVar9 = iVar16;
      iVar19 = iVar20;
      iVar21 = iVar17;
      if (iVar17 < iVar16) {
        iVar9 = iVar17;
        iVar19 = iVar7;
        iVar21 = iVar16;
        iVar7 = iVar20;
      }
      iVar20 = iVar19 - iVar7;
      bVar2 = iVar7 <= iVar19;
      iVar19 = -iVar20;
      if (0 < iVar20) {
        iVar19 = iVar20;
      }
      uVar12 = (long)(iVar21 - iVar9) / 2 & 0xffffffff;
      if (iVar17 < iVar16) {
        iVar16 = iVar17;
      }
      for (lVar15 = (long)iVar16; lVar15 <= iVar21; lVar15 = lVar15 + 1) {
        iVar16 = (int)lVar15;
        if (uVar22 < uVar5) {
          grid[iVar7][lVar15] = 1;
          bfs.dist_ = (int **)CONCAT44(iVar4 + iVar16,iVar3 + iVar7);
          std::
          _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
          ::_M_insert_unique<sbpl_2Dcell_t>(&cells->_M_t,(sbpl_2Dcell_t *)&bfs);
        }
        else {
          grid[lVar15][iVar7] = 1;
          bfs.dist_ = (int **)CONCAT44(iVar7 + iVar4,iVar3 + iVar16);
          std::
          _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
          ::_M_insert_unique<sbpl_2Dcell_t>(&cells->_M_t,(sbpl_2Dcell_t *)&bfs);
        }
        iVar17 = (int)uVar12;
        uVar18 = iVar17 - iVar19;
        if (((int)uVar18 < 0) && (iVar16 != iVar21)) {
          iVar11 = iVar7 + (uint)(iVar20 != 0 && bVar2) * 2 + -1;
          bVar29 = (int)(iVar17 + uVar18) < 0;
          if (SBORROW4(iVar17,-uVar18) != bVar29) {
            iVar7 = iVar11;
          }
          iVar16 = iVar16 + (uint)(SBORROW4(iVar17,-uVar18) == bVar29);
          if (uVar22 < uVar5) {
            grid[iVar7][iVar16] = 1;
            bfs.dist_ = (int **)CONCAT44(iVar16 + iVar4,iVar7 + iVar3);
            std::
            _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
            ::_M_insert_unique<sbpl_2Dcell_t>(&cells->_M_t,(sbpl_2Dcell_t *)&bfs);
          }
          else {
            grid[iVar16][iVar7] = 1;
            bfs.dist_ = (int **)CONCAT44(iVar7 + iVar4,iVar16 + iVar3);
            std::
            _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
            ::_M_insert_unique<sbpl_2Dcell_t>(&cells->_M_t,(sbpl_2Dcell_t *)&bfs);
          }
          uVar18 = uVar18 + (iVar21 - iVar9);
          iVar7 = iVar11;
        }
        uVar12 = (ulong)uVar18;
      }
    }
    sbpl_bfs_2d::sbpl_bfs_2d(&bfs,uVar10,sy,1,-1);
    sbpl_bfs_2d::compute_distance_from_point(&bfs,grid,0,0);
    for (uVar13 = 0; uVar24 != uVar13; uVar13 = uVar13 + 1) {
      if (grid[uVar13] != (int *)0x0) {
        operator_delete__(grid[uVar13]);
      }
    }
    operator_delete__(grid);
    for (lVar15 = 1; lVar15 < iVar27 + 2; lVar15 = lVar15 + 1) {
      iVar23 = iVar25;
      for (lVar28 = 1; lVar28 < iVar14 + 2; lVar28 = lVar28 + 1) {
        if (bfs.dist_[lVar15][lVar28] < 0) {
          local_90.x = iVar3 + (int)lVar15;
          local_90.y = iVar23;
          std::
          _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
          ::_M_insert_unique<sbpl_2Dcell_t>(&cells->_M_t,&local_90);
        }
        iVar23 = iVar23 + 1;
      }
    }
    sbpl_bfs_2d::~sbpl_bfs_2d(&bfs);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&disc_polygon.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  }
  return;
}

Assistant:

void get_2d_footprint_cells(vector<sbpl_2Dpt_t> polygon, set<sbpl_2Dcell_t>* cells, sbpl_xy_theta_pt_t pose, double res)
{
    //special case for point robot
    if (polygon.size() <= 1) {
        sbpl_2Dcell_t cell;
        cell.x = CONTXY2DISC(pose.x, res);
        cell.y = CONTXY2DISC(pose.y, res);

        cells->insert(cell);
        return;
    }

    //run bressenham line algorithm around the polygon (add them to the cells set)
    //while doing that find the min and max (x,y) and the average x and y
    double cth = cos(pose.theta);
    double sth = sin(pose.theta);

    vector<pair<int, int> > disc_polygon;
    disc_polygon.reserve(polygon.size() + 1);
    int minx = INFINITECOST;
    int maxx = -INFINITECOST;
    int miny = INFINITECOST;
    int maxy = -INFINITECOST;

    //find the bounding box of the polygon
    for (unsigned int i = 0; i < polygon.size(); i++) {
        pair<int, int> p;
        //		p.first = CONTXY2DISC(cth*polygon[i].x - sth*polygon[i].y + pose.x, res);
        double cx = (cth * polygon[i].x - sth * polygon[i].y + pose.x);
        double cy = (sth * polygon[i].x + cth * polygon[i].y + pose.y);
        p.first = (int)(cx > 0 ? cx / res + 0.5 : cx / res - 0.5); //(int)(cx / res + 0.5 * sign(c);
        //		p.second = CONTXY2DISC(sth*polygon[i].x + cth*polygon[i].y + pose.y, res);
        p.second = (int)(cy > 0 ? cy / res + 0.5 : cy / res - 0.5);//(int)(cy / res + 0.5);
        disc_polygon.push_back(p);
        if (p.first < minx) minx = p.first;
        if (p.first > maxx) maxx = p.first;
        if (p.second < miny) miny = p.second;
        if (p.second > maxy) maxy = p.second;
    }
    disc_polygon.push_back(disc_polygon.front());

    //make a grid big enough for the footprint
    int sizex = (maxx - minx + 1) + 2;
    int sizey = (maxy - miny + 1) + 2;
    int** grid = new int*[sizex];
    for (int i = 0; i < sizex; i++) {
        grid[i] = new int[sizey];
        for (int j = 0; j < sizey; j++)
            grid[i][j] = 0;
    }

    //plot line points on the grid
    for (unsigned int i = 1; i < disc_polygon.size(); i++) {
        int x0 = disc_polygon[i - 1].first - minx + 1;
        int y0 = disc_polygon[i - 1].second - miny + 1;
        int x1 = disc_polygon[i].first - minx + 1;
        int y1 = disc_polygon[i].second - miny + 1;

        //bressenham (add the line cells to the set and to a vector)
        bool steep = abs(y1 - y0) > abs(x1 - x0);
        if (steep) {
            int temp = x0;
            x0 = y0;
            y0 = temp;
            temp = x1;
            x1 = y1;
            y1 = temp;
        }
        if (x0 > x1) {
            int temp = x0;
            x0 = x1;
            x1 = temp;
            temp = y0;
            y0 = y1;
            y1 = temp;
        }
        int deltax = x1 - x0;
        int deltay = abs(y1 - y0);
        int error = deltax / 2;
        int ystep = (y0 < y1 ? 1 : -1);
        int y = y0;
        for (int x = x0; x <= x1; x++) {
            if (steep) {
                grid[y][x] = 1;
                cells->insert(sbpl_2Dcell_t(y - 1 + minx, x - 1 + miny));
            }
            else {
                grid[x][y] = 1;
                cells->insert(sbpl_2Dcell_t(x - 1 + minx, y - 1 + miny));
            }
            int last_error = error;
            error -= deltay;
            if (error < 0 && x != x1) {
                //make sure we can't have a diagonal line (the 8-connected bfs will leak through)

                int tempy = y;
                int tempx = x;
                if (last_error < -error)
                    tempy += ystep;
                else
                    tempx += 1;
                if (steep) {
                    grid[tempy][tempx] = 1;
                    cells->insert(sbpl_2Dcell_t(tempy - 1 + minx, tempx - 1 + miny));
                }
                else {
                    grid[tempx][tempy] = 1;
                    cells->insert(sbpl_2Dcell_t(tempx - 1 + minx, tempy - 1 + miny));
                }

                y += ystep;
                error += deltax;
            }
        }
    }

    //run a 2d bfs from the average (x,y)
    sbpl_bfs_2d bfs(sizex, sizey, 1);
    bfs.compute_distance_from_point(grid, 0, 0);

    for (int i = 0; i < sizex; i++)
        delete[] grid[i];
    delete[] grid;

    //add all cells expanded to the cells set
    for (int i = 1; i < sizex - 1; i++) {
        for (int j = 1; j < sizey - 1; j++) {
            if (bfs.get_distance(i, j) < 0) cells->insert(sbpl_2Dcell_t(i - 1 + minx, j - 1 + miny));
        }
    }
}